

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

void sokoban_detect(level *lev)

{
  rm *prVar1;
  char cVar2;
  obj *poVar3;
  boolean bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  trap *ptVar9;
  long lVar10;
  vptrs *pvVar11;
  
  for (lVar8 = 1; lVar8 != 0x50; lVar8 = lVar8 + 1) {
    for (lVar10 = 0; lVar10 != 0x15; lVar10 = lVar10 + 1) {
      prVar1 = lev->locations[lVar8] + lVar10;
      lev->locations[lVar8][lVar10].seenv = 0xff;
      cVar2 = lev->locations[lVar8][lVar10].typ;
      if (cVar2 == '\x18') {
LAB_001618ab:
        uVar6 = *(int *)&prVar1->field_0x6 * 2 & 0x800;
      }
      else {
        if (cVar2 == '\x10') {
          prVar1->typ = '\x18';
          goto LAB_001618ab;
        }
        uVar6 = 0x800;
        if (cVar2 == '\x0f') {
          prVar1->typ = '\x17';
        }
      }
      *(uint *)&prVar1->field_0x6 = *(uint *)&prVar1->field_0x6 & 0xfffff7ff | uVar6;
      uVar6 = back_to_cmap(lev,(xchar)lVar8,(xchar)lVar10);
      *(uint *)prVar1 = *(uint *)prVar1 & 0xffffffc0 | uVar6 & 0x3f;
      *(uint *)&prVar1->field_0x6 =
           (uint)(uVar6 - 0x19 < 4) * 3 | *(uint *)&prVar1->field_0x6 & 0xfffffffc;
      pvVar11 = (vptrs *)(lev->objects[lVar8] + lVar10);
      while (poVar3 = pvVar11->v_nexthere, poVar3 != (obj *)0x0) {
        if (poVar3->otyp == 0x214) {
          uVar6 = 0x10a800;
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum != u.umonster) {
              bVar4 = dmgtype(youmonst.data,0x24);
              if (bVar4 != '\0') goto LAB_00161974;
            }
            iVar7 = display_rng(0x219);
            uVar6 = iVar7 * 0x800 + 0x1000U & 0x1ff800;
          }
LAB_00161974:
          *(uint *)prVar1 = *(uint *)prVar1 & 0xffe007ff | uVar6;
        }
        pvVar11 = &poVar3->v;
      }
    }
  }
  ptVar9 = (trap *)&lev->lev_traps;
  do {
    ptVar9 = ptVar9->ntrap;
    if (ptVar9 == (trap *)0x0) {
      return;
    }
    bVar5 = ptVar9->field_0x8 | 0x20;
    ptVar9->field_0x8 = bVar5;
    if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_00161a13:
      uVar6 = (uint)bVar5;
    }
    else {
      if (u.umonnum != u.umonster) {
        bVar4 = dmgtype(youmonst.data,0x24);
        if (bVar4 != '\0') {
          bVar5 = ptVar9->field_0x8;
          goto LAB_00161a13;
        }
      }
      iVar7 = display_rng(0x18);
      uVar6 = iVar7 + 1;
    }
    *(uint *)(lev->locations[ptVar9->tx] + ptVar9->ty) =
         *(uint *)(lev->locations[ptVar9->tx] + ptVar9->ty) & 0xfffff83f | (uVar6 & 0x1f) << 6;
  } while( true );
}

Assistant:

void sokoban_detect(struct level *lev)
{
	int x, y;
	struct trap *ttmp;
	struct obj *obj;

	/* Map the background and boulders */
	for (x = 1; x < COLNO; x++)
	    for (y = 0; y < ROWNO; y++) {
		struct rm *loc = &lev->locations[x][y];
		int cmap;

		/* Set seen vector for all locations so travelling works
		 * on pre-mapped levels. */
		loc->seenv = SVALL;
		if (loc->typ == SDOOR)
		    loc->typ = DOOR;
		else if (loc->typ == SCORR)
		    loc->typ = CORR;
		loc->waslit = (loc->typ != CORR) ? TRUE : loc->lit;
		cmap = back_to_cmap(lev, x, y);

		loc->mem_bg = cmap;
		if (cmap == S_vodoor || cmap == S_hodoor ||
		    cmap == S_vcdoor || cmap == S_hcdoor) {
		    lev->locations[x][y].mem_door_l = 1;
		    lev->locations[x][y].mem_door_t = 1;
		} else {
		    lev->locations[x][y].mem_door_l = 0;
		    lev->locations[x][y].mem_door_t = 0;
		}

		for (obj = lev->objects[x][y]; obj; obj = obj->nexthere)
		    if (obj->otyp == BOULDER)
			loc->mem_obj = what_obj(BOULDER) + 1;
	    }

	/* Map the traps */
	for (ttmp = lev->lev_traps; ttmp; ttmp = ttmp->ntrap) {
	    ttmp->tseen = 1;
	    lev->locations[ttmp->tx][ttmp->ty].mem_trap = what_trap(ttmp->ttyp);
	}
}